

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsEqualDifferingOrderOfUnits_Test::~Equality_unitsEqualDifferingOrderOfUnits_Test
          (Equality_unitsEqualDifferingOrderOfUnits_Test *this)

{
  Equality_unitsEqualDifferingOrderOfUnits_Test *this_local;
  
  ~Equality_unitsEqualDifferingOrderOfUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsEqualDifferingOrderOfUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 1.0, "unit_id");
    u1->addUnit("metre", 3.0);
    u2->addUnit("metre", 3.0);
    u2->addUnit("second", 1.0, "unit_id");

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}